

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::Calc_Sxi_D
          (ChElementShellANCF_3833 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta,
          double thickness,double zoffset)

{
  VectorN Sxi_D_col;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_170;
  VectorN local_140;
  
  Calc_Sxi_xi_compact(this,&local_140,xi,eta,zeta,thickness,zoffset);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_170,Sxi_D,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>,Eigen::Matrix<double,24,1,0,24,1>>
            ((Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true> *)&local_170,&local_140);
  Calc_Sxi_eta_compact(this,&local_140,xi,eta,zeta,thickness,zoffset);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_170,Sxi_D,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>,Eigen::Matrix<double,24,1,0,24,1>>
            ((Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true> *)&local_170,&local_140);
  Calc_Sxi_zeta_compact(this,&local_140,xi,eta,zeta,thickness,zoffset);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_170,Sxi_D,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>,Eigen::Matrix<double,24,1,0,24,1>>
            ((Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true> *)&local_170,&local_140);
  return;
}

Assistant:

void ChElementShellANCF_3833::Calc_Sxi_D(MatrixNx3c& Sxi_D,
                                         double xi,
                                         double eta,
                                         double zeta,
                                         double thickness,
                                         double zoffset) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta, thickness, zoffset);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta, thickness, zoffset);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta, thickness, zoffset);
    Sxi_D.col(2) = Sxi_D_col;
}